

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<kj::_::(anonymous_namespace)::SiPair_&> __thiscall
kj::
Table<kj::_::(anonymous_namespace)::SiPair,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>>
::find<0ul,char_const(&)[4]>
          (Table<kj::_::(anonymous_namespace)::SiPair,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>>
           *this,char (*params) [4])

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  uint hash;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  uint *puVar9;
  ulong uVar10;
  ArrayPtr<const_unsigned_char> s;
  
  if (*(long *)(this + 0x38) != 0) {
    lVar1 = *(long *)this;
    sVar7 = strlen(*params);
    s.size_ = sVar7;
    s.ptr = (uchar *)params;
    hash = _::HashCoder::operator*((HashCoder *)&_::HASHCODER,s);
    uVar5 = _::chooseBucket(hash,*(uint *)(this + 0x38));
    lVar2 = *(long *)(this + 0x30);
    uVar10 = (ulong)uVar5;
    uVar5 = *(uint *)(lVar2 + 4 + uVar10 * 8);
    if (uVar5 != 0) {
      puVar9 = (uint *)(lVar2 + uVar10 * 8);
      uVar3 = *(ulong *)(this + 0x38);
      do {
        if ((uVar5 != 1) && (*puVar9 == hash)) {
          uVar8 = (ulong)(uVar5 - 2);
          lVar4 = *(long *)(lVar1 + 8 + uVar8 * 0x18);
          sVar7 = strlen(*params);
          if ((lVar4 == sVar7 + 1) &&
             (iVar6 = bcmp(*(void **)(lVar1 + uVar8 * 0x18),params,lVar4 - 1), iVar6 == 0)) {
            return (Maybe<kj::_::(anonymous_namespace)::SiPair_&>)
                   (SiPair *)(uVar8 * 0x18 + *(long *)this);
          }
        }
        uVar8 = uVar10 + 1;
        uVar10 = uVar8 & 0xffffffff;
        if (uVar8 == uVar3) {
          uVar10 = 0;
        }
        puVar9 = (uint *)(lVar2 + uVar10 * 8);
        uVar5 = puVar9[1];
      } while (uVar5 != 0);
      return (Maybe<kj::_::(anonymous_namespace)::SiPair_&>)(SiPair *)0x0;
    }
  }
  return (Maybe<kj::_::(anonymous_namespace)::SiPair_&>)(SiPair *)0x0;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }